

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

uint32_t __thiscall
asmjit::v1_14::RALocalAllocator::decideOnReassignment
          (RALocalAllocator *this,RegGroup group,uint32_t workId,uint32_t physId,
          RegMask allocableRegs,RAInst *raInst)

{
  RAWorkReg RVar1;
  RAWorkReg *pRVar2;
  uint uVar3;
  uint32_t uVar4;
  RAWorkReg **ppRVar5;
  RATiedReg *pRVar6;
  
  if (allocableRegs == 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/ralocal.cpp"
               ,0x47e,"allocableRegs != 0");
  }
  ppRVar5 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                      (&this->_pass->_workRegs,(ulong)workId);
  pRVar2 = *ppRVar5;
  RVar1 = pRVar2[0x4a];
  uVar3 = (uint)(byte)RVar1;
  if (((byte)RVar1 == 0xff) || ((allocableRegs >> ((byte)RVar1 & 0x1f) & 1) == 0)) {
    pRVar6 = RAInst::tiedRegForWorkReg(raInst,group,workId);
    if ((pRVar6 == (RATiedReg *)0x0) || ((pRVar6->_flags & (kKill|kOut)) == kNone)) {
      uVar3 = 0xff;
      if ((((byte)pRVar2[0x24] & 4) == 0) && ((~*(uint *)(pRVar2 + 0x38) & allocableRegs) != 0)) {
        uVar4 = pickBestSuitableRegister(this,group,~*(uint *)(pRVar2 + 0x38) & allocableRegs);
        return uVar4;
      }
    }
    else {
      uVar3 = 0;
      if (allocableRegs != 0) {
        for (; (allocableRegs >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
    }
  }
  return uVar3;
}

Assistant:

uint32_t RALocalAllocator::decideOnReassignment(RegGroup group, uint32_t workId, uint32_t physId, RegMask allocableRegs, RAInst* raInst) const noexcept {
  ASMJIT_ASSERT(allocableRegs != 0);
  DebugUtils::unused(physId);

  RAWorkReg* workReg = workRegById(workId);

  // Prefer reassignment back to HomeId, if possible.
  if (workReg->hasHomeRegId()) {
    if (Support::bitTest(allocableRegs, workReg->homeRegId())) {
      return workReg->homeRegId();
    }
  }

  // Prefer assignment to a temporary register in case this register is killed by the instruction (or has an out slot).
  const RATiedReg* tiedReg = raInst->tiedRegForWorkReg(group, workId);
  if (tiedReg && tiedReg->isOutOrKill()) {
    return Support::ctz(allocableRegs);
  }

  // Prefer reassignment if this register is only used within a single basic block.
  if (workReg->isWithinSingleBasicBlock()) {
    RegMask filteredRegs = allocableRegs & ~workReg->clobberSurvivalMask();
    if (filteredRegs) {
      return pickBestSuitableRegister(group, filteredRegs);
    }
  }

  // TODO: [Register Allocator] This could be improved.

  // Decided to SPILL.
  return RAAssignment::kPhysNone;
}